

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall kj::InsertionOrderIndex::reserve(InsertionOrderIndex *this,size_t size)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  Link *to;
  Link *newLinks;
  Fault local_48;
  Fault f_2;
  Fault f_1;
  size_t allocation;
  Fault local_20;
  Fault f;
  size_t size_local;
  InsertionOrderIndex *this_local;
  
  f.exception = (Exception *)size;
  if (0x7fffffff < size) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
               ,0x33d,FAILED,"size < (1u << 31)","\"Table too big for InsertionOrderIndex\"",
               (char (*) [38])"Table too big for InsertionOrderIndex");
    _::Debug::Fault::fatal(&local_20);
  }
  if (this->capacity < size) {
    uVar2 = _::lg((uint)size);
    f_1.exception = (Exception *)(ulong)(uint)(1 << ((char)uVar2 + 1U & 0x1f));
    if (f_1.exception <= f.exception) {
      _::Debug::Fault::Fault
                (&f_2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                 ,0x345,FAILED,"allocation > size","");
      _::Debug::Fault::fatal(&f_2);
    }
    if (f.exception * 2 < f_1.exception) {
      _::Debug::Fault::Fault
                (&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                 ,0x346,FAILED,"allocation <= size * 2","");
      _::Debug::Fault::fatal(&local_48);
    }
    newLinks._4_4_ = 8;
    f_1.exception =
         (Exception *)max<unsigned_long&,int>((unsigned_long *)&f_1,(int *)((long)&newLinks + 4));
    auVar1._8_8_ = 0;
    auVar1._0_8_ = f_1.exception;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    to = (Link *)operator_new__(uVar3);
    memset(to,0xff,(long)f_1.exception << 3);
    _::acopy<kj::InsertionOrderIndex::Link>(to,this->links,(ulong)(this->capacity + 1));
    if ((this->links != (Link *)&EMPTY_LINK) && (this->links != (Link *)0x0)) {
      operator_delete__(this->links);
    }
    this->links = to;
    this->capacity = (int)f_1.exception - 1;
  }
  return;
}

Assistant:

void InsertionOrderIndex::reserve(size_t size) {
  KJ_ASSERT(size < (1u << 31), "Table too big for InsertionOrderIndex");

  if (size > capacity) {
    // Need to grow.
    // Note that `size` and `capacity` do not include the special link[0].

    // Round up to the next power of 2.
    size_t allocation = 1u << (_::lg(size) + 1);
    KJ_DASSERT(allocation > size);
    KJ_DASSERT(allocation <= size * 2);

    // Round first allocation up to 8.
    allocation = kj::max(allocation, 8);

    Link* newLinks = new Link[allocation];
#ifdef KJ_DEBUG
    // To catch bugs, fill unused links with 0xff.
    memset(newLinks, 0xff, allocation * sizeof(Link));
#endif
    _::acopy(newLinks, links, capacity + 1);
    if (links != &EMPTY_LINK) delete[] links;
    links = newLinks;
    capacity = allocation - 1;
  }
}